

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_evaluator.cpp
# Opt level: O3

void __thiscall
TestEvaluator_TestError_Test::~TestEvaluator_TestError_Test(TestEvaluator_TestError_Test *this)

{
  testing::Test::~Test(&this->super_Test);
  operator_delete(this,0x10);
  return;
}

Assistant:

TEST(TestEvaluator, TestError){
    cout << R"(
            ---- test_error----
            )" << endl;
    string buff = R"(
                  if(10>1){
                    if(10>1){
                      true + false
                   }
                   return 1
                  })";
    Lexer* l = Lexer::New(buff);
    Parser* parser = Parser::New(l);
    auto env = Evaluator::NewEnvironment();
    auto program = parser->parseProgram();
    auto obj = Evaluator::evalProgram(program, env);
    EXPECT_TRUE(!obj.empty());
    EXPECT_EQ(obj.size(), 1);
}